

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

TValue * lj_tab_newkey(lua_State *L,GCtab *t,cTValue *key)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  ulong uVar6;
  GCobj *o;
  uint uVar7;
  TValue *pTVar8;
  TValue *pTVar9;
  
  pTVar2 = &hashkey(t,key)->val;
  if (((pTVar2->field_2).it != 0xffffffff) || (t->hmask == 0)) {
    pTVar8 = (TValue *)(ulong)(t->node).ptr32;
    uVar6 = (ulong)((MRef *)((long)pTVar8 + 0x14))->ptr32;
    pTVar1 = (TValue *)(uVar6 + 0x10);
    do {
      pTVar3 = pTVar1;
      if (pTVar3 + -2 == pTVar8) {
        rehashtab(L,t,key);
        pTVar4 = lj_tab_set(L,t,key);
        pTVar9 = pTVar2;
        goto LAB_0010ba53;
      }
      pTVar1 = pTVar3 + -3;
      uVar7 = (int)uVar6 - 0x18;
      uVar6 = (ulong)uVar7;
    } while (*(int *)((long)pTVar3 + -0x1c) != -1);
    ((MRef *)((long)pTVar8 + 0x14))->ptr32 = uVar7;
    pTVar4 = &hashkey(t,pTVar2 + 1)->val;
    pTVar9 = pTVar3 + -5;
    if (pTVar4 == pTVar2) {
      pTVar4 = (TValue *)(ulong)pTVar2[2].u32.lo;
      (pTVar1->u32).lo = pTVar2[2].u32.lo;
      pTVar2[2].u32.lo = uVar7;
    }
    else {
      do {
        pTVar5 = pTVar4;
        pTVar4 = (TValue *)(ulong)pTVar5[2].u32.lo;
      } while (pTVar2 != pTVar4);
      pTVar5[2].u32.lo = uVar7;
      pTVar3[-5].field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)pTVar2;
      pTVar3[-4] = pTVar2[1];
      (pTVar1->field_2).field_0 = pTVar2[2].field_2.field_0;
      pTVar2[2].u32.lo = 0;
      (pTVar2->field_2).it = 0xffffffff;
      uVar7 = (pTVar1->u32).lo;
      pTVar5 = pTVar9;
      while (pTVar4 = (TValue *)(ulong)uVar7, pTVar9 = pTVar2, uVar7 != 0) {
        if (((*(int *)((long)pTVar4 + 0xc) == -5) && ((pTVar4->field_2).it != 0xffffffff)) &&
           ((TValue *)
            ((ulong)(t->node).ptr32 +
            (ulong)(t->hmask & *(uint *)((ulong)pTVar4[1].u32.lo + 8)) * 0x18) == pTVar2)) {
          (pTVar1->field_2).field_0 = pTVar4[2].field_2.field_0;
          pTVar4[2].field_2.field_0 = pTVar2[2].field_2.field_0;
          pTVar2[2].u32.lo = uVar7;
          pTVar4 = pTVar5;
        }
        pTVar1 = pTVar4 + 2;
        pTVar5 = pTVar4;
        uVar7 = pTVar4[2].u32.lo;
      }
    }
LAB_0010ba53:
    pTVar2 = pTVar9;
    if (pTVar3 + -2 == pTVar8) {
      return pTVar4;
    }
  }
  pTVar2[1] = *key;
  if ((t->marked & 4) != 0) {
    uVar6 = (ulong)(L->glref).ptr32;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr32 = *(uint32_t *)(uVar6 + 0x3c);
    *(int *)(uVar6 + 0x3c) = (int)t;
  }
  return pTVar2;
}

Assistant:

TValue *lj_tab_newkey(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n = hashkey(t, key);
  if (!tvisnil(&n->val) || t->hmask == 0) {
    Node *nodebase = noderef(t->node);
    Node *collide, *freenode = noderef(nodebase->freetop);
    lua_assert(freenode >= nodebase && freenode <= nodebase+t->hmask+1);
    do {
      if (freenode == nodebase) {  /* No free node found? */
	rehashtab(L, t, key);  /* Rehash table. */
	return lj_tab_set(L, t, key);  /* Retry key insertion. */
      }
    } while (!tvisnil(&(--freenode)->key));
    setmref(nodebase->freetop, freenode);
    lua_assert(freenode != &G(L)->nilnode);
    collide = hashkey(t, &n->key);
    if (collide != n) {  /* Colliding node not the main node? */
      while (noderef(collide->next) != n)  /* Find predecessor. */
	collide = nextnode(collide);
      setmref(collide->next, freenode);  /* Relink chain. */
      /* Copy colliding node into free node and free main node. */
      freenode->val = n->val;
      freenode->key = n->key;
      freenode->next = n->next;
      setmref(n->next, NULL);
      setnilV(&n->val);
      /* Rechain pseudo-resurrected string keys with colliding hashes. */
      while (nextnode(freenode)) {
	Node *nn = nextnode(freenode);
	if (tvisstr(&nn->key) && !tvisnil(&nn->val) &&
	    hashstr(t, strV(&nn->key)) == n) {
	  freenode->next = nn->next;
	  nn->next = n->next;
	  setmref(n->next, nn);
	} else {
	  freenode = nn;
	}
      }
    } else {  /* Otherwise use free node. */
      setmrefr(freenode->next, n->next);  /* Insert into chain. */
      setmref(n->next, freenode);
      n = freenode;
    }
  }
  n->key.u64 = key->u64;
  if (LJ_UNLIKELY(tvismzero(&n->key)))
    n->key.u64 = 0;
  lj_gc_anybarriert(L, t);
  lua_assert(tvisnil(&n->val));
  return &n->val;
}